

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O3

void __thiscall HighsLp::userBoundScale(HighsLp *this,HighsInt user_bound_scale)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  
  iVar4 = user_bound_scale - this->user_bound_scale_;
  if (iVar4 != 0) {
    dVar5 = ldexp(1.0,iVar4);
    iVar4 = this->num_col_;
    if (0 < (long)iVar4) {
      pdVar1 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = 0;
      do {
        pdVar1[lVar3] = pdVar1[lVar3] * dVar5;
        pdVar2[lVar3] = pdVar2[lVar3] * dVar5;
        lVar3 = lVar3 + 1;
      } while (iVar4 != lVar3);
    }
    iVar4 = this->num_row_;
    if (0 < (long)iVar4) {
      pdVar1 = (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = 0;
      do {
        pdVar1[lVar3] = pdVar1[lVar3] * dVar5;
        pdVar2[lVar3] = pdVar2[lVar3] * dVar5;
        lVar3 = lVar3 + 1;
      } while (iVar4 != lVar3);
    }
    this->user_bound_scale_ = user_bound_scale;
  }
  return;
}

Assistant:

void HighsLp::userBoundScale(const HighsInt user_bound_scale) {
  const HighsInt dl_user_bound_scale =
      user_bound_scale - this->user_bound_scale_;
  if (!dl_user_bound_scale) return;
  double dl_user_bound_scale_value = std::pow(2, dl_user_bound_scale);
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
    this->col_lower_[iCol] *= dl_user_bound_scale_value;
    this->col_upper_[iCol] *= dl_user_bound_scale_value;
  }
  for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
    this->row_lower_[iRow] *= dl_user_bound_scale_value;
    this->row_upper_[iRow] *= dl_user_bound_scale_value;
  }
  // Record the current user bound scaling applied to the LP
  this->user_bound_scale_ = user_bound_scale;
}